

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::rtrim(string *str)

{
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  undefined8 local_18;
  
  ::std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>
            (&local_18);
  ::std::__cxx11::string::erase(str,local_18,(str->_M_dataplus)._M_p + str->_M_string_length);
  return str;
}

Assistant:

inline std::string &rtrim(std::string &str) {
    auto it = std::find_if(str.rbegin(), str.rend(), [](char ch) { return !std::isspace<char>(ch, std::locale()); });
    str.erase(it.base(), str.end());
    return str;
}